

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O0

int dwarf_die_abbrev_global_offset
              (Dwarf_Die die,Dwarf_Off *abbrev_goffset,Dwarf_Unsigned *abbrev_count,
              Dwarf_Error *error)

{
  Dwarf_Debug pDVar1;
  Dwarf_Abbrev_List_conflict pDVar2;
  Dwarf_Debug ckdi_dbg;
  Dwarf_Debug dbg;
  Dwarf_Abbrev_List_conflict dal;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *abbrev_count_local;
  Dwarf_Off *abbrev_goffset_local;
  Dwarf_Die die_local;
  
  if (die == (Dwarf_Die)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x34);
    die_local._4_4_ = 1;
  }
  else if (die->di_cu_context == (Dwarf_CU_Context_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x68);
    die_local._4_4_ = 1;
  }
  else {
    pDVar1 = die->di_cu_context->cc_dbg;
    if ((pDVar1 == (Dwarf_Debug)0x0) || (pDVar1->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      die_local._4_4_ = 1;
    }
    else {
      pDVar2 = die->di_abbrev_list;
      if (pDVar2 == (Dwarf_Abbrev_List_conflict)0x0) {
        _dwarf_error(die->di_cu_context->cc_dbg,error,0x6e);
        die_local._4_4_ = 1;
      }
      else {
        *abbrev_goffset = pDVar2->abl_goffset;
        *abbrev_count = pDVar2->abl_abbrev_count;
        die_local._4_4_ = 0;
      }
    }
  }
  return die_local._4_4_;
}

Assistant:

int
dwarf_die_abbrev_global_offset(Dwarf_Die die,
    Dwarf_Off       * abbrev_goffset,
    Dwarf_Unsigned  * abbrev_count,
    Dwarf_Error*      error)
{
    Dwarf_Abbrev_List dal = 0;
    Dwarf_Debug dbg = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    dbg = die->di_cu_context->cc_dbg;
    dal = die->di_abbrev_list;
    if (!dal) {
        _dwarf_error(dbg,error,DW_DLE_DWARF_ABBREV_NULL);
        return DW_DLV_ERROR;
    }
    *abbrev_goffset = dal->abl_goffset;
    *abbrev_count = dal->abl_abbrev_count;
    return DW_DLV_OK;
}